

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

ArrayBuilder<kj::StringPtr> * __thiscall
kj::ArrayBuilder<kj::HashMap<unsigned_long,_kj::StringPtr>::Entry>::operator=
          (ArrayBuilder<kj::HashMap<unsigned_long,_kj::StringPtr>::Entry> *this,
          ArrayBuilder<kj::StringPtr> *other)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  lVar1 = *(long *)this;
  if (lVar1 != 0) {
    lVar2 = *(long *)(this + 8);
    lVar3 = *(long *)(this + 0x10);
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
    *(undefined8 *)(this + 0x10) = 0;
    (**(code **)**(undefined8 **)(this + 0x18))
              (*(undefined8 **)(this + 0x18),lVar1,0x18,(lVar2 - lVar1 >> 3) * -0x5555555555555555,
               (lVar3 - lVar1 >> 3) * -0x5555555555555555,0);
  }
  *(StringPtr **)this = other->ptr;
  *(RemoveConst<kj::StringPtr> **)(this + 8) = other->pos;
  *(StringPtr **)(this + 0x10) = other->endPtr;
  *(ArrayDisposer **)(this + 0x18) = other->disposer;
  other->ptr = (StringPtr *)0x0;
  other->pos = (RemoveConst<kj::StringPtr> *)0x0;
  other->endPtr = (StringPtr *)0x0;
  return (ArrayBuilder<kj::StringPtr> *)this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }